

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O2

int __thiscall deqp::gles3::Performance::LoopCase::init(LoopCase *this,EVP_PKEY_CTX *ctx)

{
  PerfCaseType PVar1;
  DecisionType DVar2;
  pointer pfVar3;
  int iVar4;
  ostream *poVar5;
  ostringstream *poVar6;
  ostringstream *stream;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  AttribSpec *__args;
  char *pcVar12;
  float fVar13;
  ostringstream vtx;
  ostringstream frag;
  Vec4 local_3c8;
  Vec4 local_3b8;
  Vec4 local_3a8;
  Vec4 local_398;
  AttribSpec local_380;
  ostream local_320;
  ostream local_1a8;
  
  PVar1 = (this->super_ControlStatementCase).super_ShaderPerformanceCase.m_caseType;
  DVar2 = this->m_decisionType;
  pcVar7 = "u_bound";
  if (DVar2 == DECISION_STATIC) {
    pcVar7 = "10.5";
  }
  pcVar10 = "loopBound";
  if ((this->m_isLoopBoundStable & 1U) != 0) {
    pcVar10 = "v_bound";
  }
  pcVar12 = "a_bound";
  if (PVar1 != CASETYPE_VERTEX) {
    pcVar12 = pcVar10;
  }
  if (DVar2 < DECISION_ATTRIBUTE) {
    pcVar12 = pcVar7;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  stream = (ostringstream *)&local_1a8;
  if (PVar1 == CASETYPE_VERTEX) {
    stream = (ostringstream *)&local_320;
  }
  std::operator<<(&local_320,"#version 300 es\n");
  std::operator<<(&local_320,"in highp vec4 a_position;\n");
  std::operator<<(&local_320,"in mediump vec4 a_value;\n");
  std::operator<<(&local_1a8,"#version 300 es\n");
  std::operator<<(&local_1a8,"layout(location = 0) out mediump vec4 o_color;\n");
  if (DVar2 - DECISION_UNIFORM < 2) {
    pcVar7 = "uniform mediump float u_bound;\n";
    poVar6 = stream;
    if (DVar2 == DECISION_ATTRIBUTE) {
      pcVar7 = "in mediump float a_bound;\n";
      poVar6 = (ostringstream *)&local_320;
    }
    std::operator<<((ostream *)poVar6,pcVar7);
  }
  if (PVar1 == CASETYPE_VERTEX) {
    std::operator<<(&local_320,"out mediump vec4 v_color;\n");
    pcVar7 = "in mediump vec4 v_color;\n";
LAB_0113ffc8:
    std::operator<<(&local_1a8,pcVar7);
  }
  else {
    std::operator<<(&local_320,"out mediump vec4 v_value;\n");
    std::operator<<(&local_1a8,"in mediump vec4 v_value;\n");
    if (DVar2 == DECISION_ATTRIBUTE) {
      std::operator<<(&local_320,"out mediump float v_bound;\n");
      pcVar7 = "in mediump float v_bound;\n";
      goto LAB_0113ffc8;
    }
  }
  std::operator<<(&local_320,"\n");
  std::operator<<(&local_320,"void main()\n");
  std::operator<<(&local_320,"{\n");
  std::operator<<(&local_320,"\tgl_Position = a_position;\n");
  std::operator<<(&local_1a8,"\n");
  std::operator<<(&local_1a8,"void main()\n");
  std::operator<<(&local_1a8,"{\n");
  std::operator<<((ostream *)stream,"\tmediump vec4 res = vec4(0.0);\n");
  if (PVar1 != CASETYPE_VERTEX && this->m_isLoopBoundStable == false) {
    poVar5 = std::operator<<(&local_1a8,"\tmediump float loopBound = fract(v_bound) < 0.5 ? ");
    poVar5 = std::operator<<(poVar5,"5.5");
    poVar5 = std::operator<<(poVar5," : ");
    poVar5 = std::operator<<(poVar5,"15.5");
    std::operator<<(poVar5,";\n");
  }
  if (this->m_type == LOOP_FOR) {
    poVar5 = std::operator<<((ostream *)stream,"\tfor (mediump float i = 0.0; i < ");
    poVar6 = (ostringstream *)std::operator<<(poVar5,pcVar12);
    pcVar7 = "; i++)\n";
  }
  else {
    std::operator<<((ostream *)stream,"\tmediump float i = 0.0;\n");
    if (this->m_type == LOOP_WHILE) {
      poVar5 = std::operator<<((ostream *)stream,"\twhile (i < ");
      poVar6 = (ostringstream *)std::operator<<(poVar5,pcVar12);
      pcVar7 = ")\n";
    }
    else {
      pcVar7 = "\tdo\n";
      poVar6 = stream;
    }
  }
  std::operator<<((ostream *)poVar6,pcVar7);
  std::operator<<((ostream *)stream,"\t{\n");
  std::operator<<((ostream *)stream,"\t\t");
  pcVar7 = "v_value";
  if (PVar1 == CASETYPE_VERTEX) {
    pcVar7 = "a_value";
  }
  writeLoopWorkload((ostringstream *)stream,"res",pcVar7);
  std::operator<<((ostream *)stream,"\n");
  pcVar7 = "\t}\n";
  if ((this->m_type != LOOP_FOR) &&
     (std::operator<<((ostream *)stream,"\t\ti++;\n"), this->m_type == LOOP_DO_WHILE)) {
    poVar5 = std::operator<<((ostream *)stream,"\t} while (i < ");
    stream = (ostringstream *)std::operator<<(poVar5,pcVar12);
    pcVar7 = ");\n";
  }
  std::operator<<((ostream *)stream,pcVar7);
  if (PVar1 == CASETYPE_VERTEX) {
    std::operator<<(&local_320,"\tv_color = res;\n");
    pcVar7 = "\to_color = v_color;\n";
  }
  else {
    if (DVar2 == DECISION_ATTRIBUTE) {
      std::operator<<(&local_320,"\tv_bound = a_bound;\n");
    }
    std::operator<<(&local_320,"\tv_value = a_value;\n");
    pcVar7 = "\to_color = res;\n";
  }
  std::operator<<(&local_1a8,pcVar7);
  std::operator<<(&local_320,"}\n");
  std::operator<<(&local_1a8,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_vertShaderSource,
             (string *)&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_fragShaderSource,
             (string *)&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  if (DVar2 == DECISION_ATTRIBUTE) {
    if (this->m_isLoopBoundStable == true) {
      local_398.m_data[0] = 10.5;
      local_398.m_data[1] = 0.0;
      local_398.m_data[2] = 0.0;
      local_398.m_data[3] = 0.0;
      local_3a8.m_data[0] = 10.5;
      local_3a8.m_data[1] = 0.0;
      local_3a8.m_data[2] = 0.0;
      local_3a8.m_data[3] = 0.0;
      local_3b8.m_data[0] = 10.5;
      local_3b8.m_data[1] = 0.0;
      local_3b8.m_data[2] = 0.0;
      local_3b8.m_data[3] = 0.0;
      local_3c8.m_data[0] = 10.5;
      local_3c8.m_data[1] = 0.0;
      local_3c8.m_data[2] = 0.0;
      local_3c8.m_data[3] = 0.0;
      deqp::gls::AttribSpec::AttribSpec
                (&local_380,"a_bound",&local_398,&local_3a8,&local_3b8,&local_3c8);
      std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
      emplace_back<deqp::gls::AttribSpec>
                (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,
                 &local_380);
    }
    else {
      if (PVar1 == CASETYPE_VERTEX) {
        std::vector<float,_std::allocator<float>_>::resize
                  (&this->m_boundArray,
                   (long)(((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_measurer
                           .m_gridSizeX * 4 + 4) *
                         ((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_measurer.
                          m_gridSizeY + 1)));
        pfVar3 = (this->m_boundArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = (ulong)((long)(this->m_boundArray).super__Vector_base<float,_std::allocator<float>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar3) >> 2;
        uVar11 = 0;
        uVar9 = uVar8 & 0xffffffff;
        if ((int)uVar8 < 1) {
          uVar9 = uVar11;
        }
        for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
          fVar13 = 0.0;
          if ((uVar11 & 3) == 0) {
            fVar13 = *(float *)(&DAT_018290dc + (ulong)((uVar11 & 4) == 0) * 4);
          }
          pfVar3[uVar11] = fVar13;
        }
        goto LAB_011403b2;
      }
      local_3c8.m_data[0] =
           (float)(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_measurer.
                  m_viewportWidth * 0.5;
      local_3a8.m_data[1] = 0.0;
      local_3a8.m_data[2] = 0.0;
      local_3a8.m_data[3] = 0.0;
      local_398.m_data[0] = 0.0;
      local_398.m_data[1] = 0.0;
      local_398.m_data[2] = 0.0;
      local_398.m_data[3] = 0.0;
      local_3c8.m_data[1] = 0.0;
      local_3c8.m_data[2] = 0.0;
      local_3b8.m_data[0] = 0.0;
      local_3b8.m_data[1] = 0.0;
      local_3b8.m_data[2] = 0.0;
      local_3b8.m_data[3] = 0.0;
      local_3c8.m_data[3] = 0.0;
      local_3a8.m_data[0] = local_3c8.m_data[0];
      deqp::gls::AttribSpec::AttribSpec
                (&local_380,"a_bound",&local_398,&local_3a8,&local_3b8,&local_3c8);
      std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
      emplace_back<deqp::gls::AttribSpec>
                (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,
                 &local_380);
    }
    std::__cxx11::string::~string((string *)&local_380);
  }
LAB_011403b2:
  local_398.m_data[0] = 0.0;
  local_398.m_data[1] = 0.1;
  local_398.m_data[2] = 0.2;
  local_398.m_data[3] = 0.3;
  local_3a8.m_data[0] = 0.4;
  local_3a8.m_data[1] = 0.5;
  local_3a8.m_data[2] = 0.6;
  local_3a8.m_data[3] = 0.7;
  local_3b8.m_data[0] = 0.8;
  local_3b8.m_data[1] = 0.9;
  local_3b8.m_data[2] = 1.0;
  local_3b8.m_data[3] = 1.1;
  local_3c8.m_data[0] = 1.2;
  local_3c8.m_data[1] = 1.3;
  local_3c8.m_data[2] = 1.4;
  local_3c8.m_data[3] = 1.5;
  deqp::gls::AttribSpec::AttribSpec
            (&local_380,"a_value",&local_398,&local_3a8,&local_3b8,&local_3c8);
  __args = &local_380;
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
  emplace_back<deqp::gls::AttribSpec>
            (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,__args);
  std::__cxx11::string::~string((string *)&local_380);
  ControlStatementCase::init(&this->super_ControlStatementCase,(EVP_PKEY_CTX *)__args);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  iVar4 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
  return iVar4;
}

Assistant:

void LoopCase::init (void)
{
	bool				isVertexCase	= m_caseType == CASETYPE_VERTEX;

	bool				isStaticCase	= m_decisionType == DECISION_STATIC;
	bool				isUniformCase	= m_decisionType == DECISION_UNIFORM;
	bool				isAttributeCase	= m_decisionType == DECISION_ATTRIBUTE;

	DE_ASSERT(isStaticCase || isUniformCase || isAttributeCase);

	DE_ASSERT(m_type == LOOP_FOR		||
			  m_type == LOOP_WHILE		||
			  m_type == LOOP_DO_WHILE);

	DE_ASSERT(isAttributeCase || m_isLoopBoundStable); // The loop bound count can vary between executions only if using attribute input.

	// \note The fractional part is .5 (instead of .0) so that these can be safely used as loop bounds.
	const float			loopBound				= 10.5f;
	const float			unstableBoundLow		= 5.5f;
	const float			unstableBoundHigh		= 15.5f;
	static const char*	loopBoundStr			= "10.5";
	static const char*	unstableBoundLowStr		= "5.5";
	static const char*	unstableBoundHighStr	= "15.5";

	const char*			boundValueStr		= isStaticCase			? loopBoundStr :
											  isUniformCase			? "u_bound" :
											  isVertexCase			? "a_bound" :
											  m_isLoopBoundStable	? "v_bound" :
																	  "loopBound";

	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op		= isVertexCase ? vtx : frag;

	vtx << "#version 300 es\n";
	vtx << "in highp vec4 a_position;\n";	// Position attribute.
	vtx << "in mediump vec4 a_value;\n";	// Input for workload calculations.

	frag << "#version 300 es\n";
	frag << "layout(location = 0) out mediump vec4 o_color;\n";

	// Value to be used as the loop iteration count.
	if (isAttributeCase)
		vtx << "in mediump float a_bound;\n";
	else if (isUniformCase)
		op << "uniform mediump float u_bound;\n";

	// Varyings.
	if (isVertexCase)
	{
		vtx << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}
	else
	{
		vtx << "out mediump vec4 v_value;\n";
		frag << "in mediump vec4 v_value;\n";

		if (isAttributeCase)
		{
			vtx << "out mediump float v_bound;\n";
			frag << "in mediump float v_bound;\n";
		}
	}

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	op << "	mediump vec4 res = vec4(0.0);\n";

	if (!m_isLoopBoundStable && !isVertexCase)
	{
		// Choose the actual loop bound based on v_bound.
		// \note Loop bound will vary with high frequency between fragment columns, given appropriate range for v_bound.
		op << "	mediump float loopBound = fract(v_bound) < 0.5 ? " << unstableBoundLowStr << " : " << unstableBoundHighStr << ";\n";
	}

	// Start a for, while or do-while loop.
	if (m_type == LOOP_FOR)
		op << "	for (mediump float i = 0.0; i < " << boundValueStr << "; i++)\n";
	else
	{
		op << "	mediump float i = 0.0;\n";
		if (m_type == LOOP_WHILE)
			op << "	while (i < " << boundValueStr << ")\n";
		else // LOOP_DO_WHILE
			op << "	do\n";
	}
	op << "	{\n";

	// Workload calculations inside the loop.
	op << "\t\t";
	writeLoopWorkload(op, "res", isVertexCase ? "a_value" : "v_value");
	op << "\n";

	// Only "for" has counter increment in the loop head.
	if (m_type != LOOP_FOR)
		op << "		i++;\n";

	// End the loop.
	if (m_type == LOOP_DO_WHILE)
		op << "	} while (i < " << boundValueStr << ");\n";
	else
		op << "	}\n";

	if (isVertexCase)
	{
		// Put result to color variable.
		vtx << "	v_color = res;\n";
		frag << "	o_color = v_color;\n";
	}
	else
	{
		// Transfer inputs to fragment shader through varyings.
		if (isAttributeCase)
			vtx << "	v_bound = a_bound;\n";
		vtx << "	v_value = a_value;\n";

		frag << "	o_color = res;\n"; // Put result to color variable.
	}

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource = vtx.str();
	m_fragShaderSource = frag.str();

	if (isAttributeCase)
	{
		if (m_isLoopBoundStable)
		{
			// Every execution has same number of iterations.

			m_attributes.push_back(AttribSpec("a_bound",	Vec4(loopBound, 0.0f, 0.0f, 0.0f),
															Vec4(loopBound, 0.0f, 0.0f, 0.0f),
															Vec4(loopBound, 0.0f, 0.0f, 0.0f),
															Vec4(loopBound, 0.0f, 0.0f, 0.0f)));
		}
		else if (isVertexCase)
		{
			// Vertex case, with non-constant number of iterations.

			const int	numComponents	= 4;
			int			numVertices		= (getGridWidth() + 1) * (getGridHeight() + 1);

			// setupProgram() will later bind this array as an attribute.
			m_boundArray.resize(numVertices * numComponents);

			// Vary between low and high loop bounds; they should average to loopBound however.
			for (int i = 0; i < (int)m_boundArray.size(); i++)
			{
				if (i % numComponents == 0)
					m_boundArray[i] = (i / numComponents) % 2 == 0 ? unstableBoundLow : unstableBoundHigh;
				else
					m_boundArray[i] = 0.0f;
			}
		}
		else // !m_isLoopBoundStable && !isVertexCase
		{
			// Fragment case, with non-constant number of iterations.
			// \note fract(a_bound) < 0.5 will be true for every second fragment.

			float minValue = 0.0f;
			float maxValue = (float)getViewportWidth()*0.5f;
			m_attributes.push_back(AttribSpec("a_bound",	Vec4(minValue, 0.0f, 0.0f, 0.0f),
															Vec4(maxValue, 0.0f, 0.0f, 0.0f),
															Vec4(minValue, 0.0f, 0.0f, 0.0f),
															Vec4(maxValue, 0.0f, 0.0f, 0.0f)));
		}
	}

	m_attributes.push_back(AttribSpec("a_value",	Vec4(0.0f, 0.1f, 0.2f, 0.3f),
													Vec4(0.4f, 0.5f, 0.6f, 0.7f),
													Vec4(0.8f, 0.9f, 1.0f, 1.1f),
													Vec4(1.2f, 1.3f, 1.4f, 1.5f)));

	ControlStatementCase::init();
}